

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixOpen(sqlite3_vfs *pVfs,char *zPath,sqlite3_file *pFile,int flags,int *pOutFlags)

{
  byte *pbVar1;
  uint uVar2;
  bool bVar3;
  pid_t pVar4;
  undefined8 uVar5;
  _func_int_sqlite3_file_ptr *p_Var6;
  sqlite3_io_methods *psVar7;
  __pid_t _Var8;
  int iVar9;
  int iVar10;
  sqlite3_io_methods *psVar11;
  size_t sVar12;
  int *piVar13;
  sqlite3_io_methods *psVar14;
  char *pcVar15;
  UnixUnusedFd **ppUVar16;
  uint *puVar17;
  sqlite3_mutex *psVar18;
  uint uVar19;
  uint uVar20;
  dev_t *pdVar21;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  mode_t m;
  int iVar26;
  unixInodeInfo *puVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  unixFileId fileId;
  stat sStat;
  char zTmpname [514];
  uint local_520;
  uint local_51c;
  uint local_510;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  uint local_4c0;
  uint local_4bc;
  uint local_4b8;
  undefined1 uStack_449;
  undefined8 local_448;
  _func_int_sqlite3_file_ptr *p_Stack_440;
  uint local_430;
  uint local_42c;
  uint local_428;
  dev_t local_238;
  u64 local_230;
  
  pVar4 = randomnessPid;
  uVar24 = flags & 0xffffff00;
  if (((flags & 4U) == 0) ||
     (((bVar3 = true, uVar24 != 0x800 && (uVar24 != 0x4000)) && (uVar24 != 0x80000)))) {
    bVar3 = false;
  }
  _Var8 = getpid();
  if (pVar4 != _Var8) {
    randomnessPid = getpid();
    sqlite3_randomness(0,(void *)0x0);
  }
  *(undefined1 (*) [16])(pFile + 0xc) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 10) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 8) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 6) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 4) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])pFile = (undefined1  [16])0x0;
  pFile[0xe].pMethods = (sqlite3_io_methods *)0x0;
  pdVar21 = (dev_t *)zPath;
  if (uVar24 == 0x100) {
    if (unixBigLock != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(unixBigLock);
    }
    if (((inodeList == (unixInodeInfo *)0x0) ||
        (iVar9 = (*aSyscall[4].pCurrent)(zPath,&local_238), iVar9 != 0)) ||
       (inodeList == (unixInodeInfo *)0x0)) {
      psVar11 = (sqlite3_io_methods *)0x0;
    }
    else {
      psVar11 = (sqlite3_io_methods *)0x0;
      puVar27 = inodeList;
      do {
        if (((puVar27->fileId).dev == local_238) && ((puVar27->fileId).ino == local_230)) {
          if (puVar27->pLockMutex != (sqlite3_mutex *)0x0) {
            (*sqlite3Config.mutex.xMutexEnter)(puVar27->pLockMutex);
          }
          psVar11 = (sqlite3_io_methods *)puVar27->pUnused;
          bVar28 = psVar11 == (sqlite3_io_methods *)0x0;
          if (bVar28) goto LAB_00134501;
          if (*(int *)&psVar11->field_0x4 != flags) goto LAB_001344dd;
          ppUVar16 = &puVar27->pUnused;
          goto LAB_001344f6;
        }
        puVar27 = puVar27->pNext;
      } while (puVar27 != (unixInodeInfo *)0x0);
    }
    goto LAB_00133eac;
  }
  local_520 = 0xffffffff;
  if (zPath == (char *)0x0) {
    iVar9 = unixGetTempname(pVfs->mxPathname,(char *)&local_238);
    pdVar21 = &local_238;
    if (iVar9 != 0) {
      return iVar9;
    }
  }
  goto LAB_00133fb3;
  while (*(int *)&psVar11->field_0x4 != flags) {
LAB_001344dd:
    psVar14 = psVar11;
    psVar11 = (sqlite3_io_methods *)psVar14->xClose;
    bVar28 = psVar11 == (sqlite3_io_methods *)0x0;
    if (bVar28) goto LAB_00134501;
  }
  ppUVar16 = (UnixUnusedFd **)&psVar14->xClose;
LAB_001344f6:
  if (!bVar28) {
    *ppUVar16 = (UnixUnusedFd *)psVar11->xClose;
  }
LAB_00134501:
  if (puVar27->pLockMutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(puVar27->pLockMutex);
  }
LAB_00133eac:
  if (unixBigLock != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(unixBigLock);
  }
  if (psVar11 == (sqlite3_io_methods *)0x0) {
    iVar9 = sqlite3_initialize();
    if (iVar9 == 0) {
      psVar11 = (sqlite3_io_methods *)sqlite3Malloc(0x10);
    }
    else {
      psVar11 = (sqlite3_io_methods *)0x0;
    }
    local_520 = 0xffffffff;
    if (psVar11 != (sqlite3_io_methods *)0x0) goto LAB_00133f99;
    bVar28 = false;
  }
  else {
    local_520 = psVar11->iVersion;
LAB_00133f99:
    pFile[6].pMethods = psVar11;
    bVar28 = true;
  }
  if (!bVar28) {
    return 7;
  }
LAB_00133fb3:
  uVar19 = flags & 8;
  local_510 = flags & 1;
  iVar22 = (flags & 4U) * 0x10;
  iVar9 = iVar22 + 0x20080;
  if ((flags & 0x10U) == 0) {
    iVar9 = iVar22;
  }
  uVar2 = iVar9 + (flags & 2U);
  local_51c = flags;
  if ((int)local_520 < 0) {
    if ((flags & 0x80800U) != 0) {
      if (pdVar21 == (dev_t *)0x0) {
        uVar25 = 0;
      }
      else {
        sVar12 = strlen((char *)pdVar21);
        uVar25 = (ulong)((uint)sVar12 & 0x3fffffff);
      }
      m = 0;
      uVar20 = 0;
      uVar23 = 0;
      iVar9 = 0;
      do {
        sVar12 = uVar25 - 1;
        if (*(char *)((long)pdVar21 + sVar12) == '-') {
          memcpy(&local_448,pdVar21,sVar12);
          (&uStack_449)[uVar25] = 0;
          iVar9 = (*aSyscall[4].pCurrent)(&local_448,&local_4d8);
          if (iVar9 != 0) goto LAB_00134269;
          m = local_4c0 & 0x1ff;
          uVar23 = (ulong)local_4b8;
          goto LAB_001342ea;
        }
        if (sVar12 == 0) goto LAB_001341ba;
        uVar25 = sVar12;
      } while (*(char *)((long)pdVar21 + sVar12) != '.');
      goto LAB_001342ed;
    }
    if (uVar19 == 0) {
      m = 0;
      if ((flags & 0x40U) == 0) {
LAB_001341ba:
        m = 0;
        goto LAB_00134296;
      }
      pcVar15 = sqlite3_uri_parameter((char *)pdVar21,"modeof");
      uVar20 = 0;
      uVar23 = 0;
      iVar9 = 0;
      if (pcVar15 != (char *)0x0) {
        iVar9 = (*aSyscall[4].pCurrent)(pcVar15,&local_448);
        if (iVar9 != 0) {
LAB_00134269:
          iVar9 = 0x70a;
          m = 0;
          uVar20 = 0;
          uVar23 = 0;
          goto LAB_001342ed;
        }
        m = local_430 & 0x1ff;
        uVar23 = (ulong)local_428;
        local_4bc = local_42c;
        goto LAB_001342ea;
      }
    }
    else {
      m = 0x180;
LAB_00134296:
      local_4bc = 0;
      uVar23 = 0;
LAB_001342ea:
      iVar9 = 0;
      uVar20 = local_4bc;
    }
LAB_001342ed:
    iVar22 = 1;
    iVar26 = iVar9;
    if (iVar9 == 0) {
      local_520 = robust_open((char *)pdVar21,uVar2,m);
      iVar9 = 0;
      iVar22 = 0xe;
      if ((int)local_520 < 0) {
        if (((bVar3) && (piVar13 = __errno_location(), *piVar13 == 0xd)) &&
           (iVar9 = (*aSyscall[2].pCurrent)(pdVar21,0), iVar9 != 0)) {
          iVar22 = 0x608;
          iVar9 = 0x608;
        }
        else {
          piVar13 = __errno_location();
          if ((flags & 2U) == 0) {
            iVar9 = 0;
          }
          else {
            if (*piVar13 != 0x15) {
              local_51c = (flags & 0xfffffff8U) + 1;
              local_520 = robust_open((char *)pdVar21,uVar2 & 0x20080,m);
              local_510 = 1;
            }
            iVar9 = 0;
          }
        }
      }
      if ((int)local_520 < 0) {
        sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0x96a5,
                    "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
        puVar17 = (uint *)__errno_location();
        if (pdVar21 == (dev_t *)0x0) {
          pdVar21 = (dev_t *)0x1fb931;
        }
        sqlite3_log(0xe,"os_unix.c:%d: (%d) %s(%s) - %s",0x96a5,(ulong)*puVar17,"open",pdVar21,"");
        iVar9 = iVar22;
        iVar22 = 2;
        iVar26 = 7;
      }
      else {
        iVar26 = 7;
        iVar22 = 0;
        if (((local_51c & 0x80800) != 0) &&
           (iVar10 = (*aSyscall[0x15].pCurrent)(), iVar22 = 0, iVar10 == 0)) {
          (*aSyscall[0x14].pCurrent)((ulong)local_520,(ulong)uVar20,uVar23);
          iVar22 = 0;
        }
      }
    }
    if (iVar22 == 2) goto LAB_00134685;
    if (iVar22 != 0) {
      return iVar26;
    }
  }
  if (pOutFlags != (int *)0x0) {
    *pOutFlags = local_51c;
  }
  psVar11 = pFile[6].pMethods;
  if (psVar11 != (sqlite3_io_methods *)0x0) {
    psVar11->iVersion = local_520;
    *(uint *)&psVar11->field_0x4 = local_51c;
  }
  if (uVar19 != 0) {
    (*aSyscall[0x10].pCurrent)();
  }
  uVar2 = uVar19 * 4 + 2;
  if (local_510 == 0) {
    uVar2 = uVar19 * 4;
  }
  uVar19 = uVar2 + 0x80;
  if (uVar24 == 0x100) {
    uVar19 = uVar2;
  }
  uVar24 = uVar19 | 8;
  if (!bVar3) {
    uVar24 = uVar19;
  }
  *(uint *)&pFile[3].pMethods = local_520;
  pFile[1].pMethods = (sqlite3_io_methods *)pVfs;
  pFile[7].pMethods = (sqlite3_io_methods *)zPath;
  *(ushort *)((long)&pFile[3].pMethods + 6) = (ushort)(local_51c & 0x40) | (ushort)uVar24 & 0xff;
  pFile[0xc].pMethods = (sqlite3_io_methods *)sqlite3Config.szMmap;
  pcVar15 = (char *)0x0;
  if ((local_51c & 0x40) != 0 || (uVar24 & 0x40) != 0) {
    pcVar15 = zPath;
  }
  iVar9 = sqlite3_uri_boolean(pcVar15,"psow",1);
  if (iVar9 != 0) {
    pbVar1 = (byte *)((long)&pFile[3].pMethods + 6);
    *pbVar1 = *pbVar1 | 0x10;
  }
  iVar9 = strcmp(pVfs->zName,"unix-excl");
  if (iVar9 == 0) {
    pbVar1 = (byte *)((long)&pFile[3].pMethods + 6);
    *pbVar1 = *pbVar1 | 1;
  }
  if ((char)uVar24 < '\0') {
    psVar11 = &nolockIoMethods;
  }
  else {
    psVar11 = (sqlite3_io_methods *)(**pVfs->pAppData)(zPath,pFile);
  }
  if (psVar11 == &posixIoMethods) {
    if (unixBigLock != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(unixBigLock);
    }
    iVar9 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&pFile[3].pMethods,&local_448);
    if (iVar9 == 0) {
      local_4d8 = local_448;
      uVar5 = local_4d8;
      uStack_4d0 = p_Stack_440;
      p_Var6 = uStack_4d0;
      for (psVar14 = (sqlite3_io_methods *)inodeList; local_4d8 = uVar5, uStack_4d0 = p_Var6,
          psVar14 != (sqlite3_io_methods *)0x0; psVar14 = (sqlite3_io_methods *)psVar14->xUnlock) {
        local_4d8._0_1_ = (char)local_448;
        local_4d8._1_1_ = (char)((ulong)local_448 >> 8);
        local_4d8._2_1_ = (char)((ulong)local_448 >> 0x10);
        local_4d8._3_1_ = (char)((ulong)local_448 >> 0x18);
        local_4d8._4_1_ = (char)((ulong)local_448 >> 0x20);
        local_4d8._5_1_ = (char)((ulong)local_448 >> 0x28);
        local_4d8._6_1_ = (char)((ulong)local_448 >> 0x30);
        local_4d8._7_1_ = (char)((ulong)local_448 >> 0x38);
        uStack_4d0._0_1_ = (char)p_Stack_440;
        uStack_4d0._1_1_ = (char)((ulong)p_Stack_440 >> 8);
        uStack_4d0._2_1_ = (char)((ulong)p_Stack_440 >> 0x10);
        uStack_4d0._3_1_ = (char)((ulong)p_Stack_440 >> 0x18);
        uStack_4d0._4_1_ = (char)((ulong)p_Stack_440 >> 0x20);
        uStack_4d0._5_1_ = (char)((ulong)p_Stack_440 >> 0x28);
        uStack_4d0._6_1_ = (char)((ulong)p_Stack_440 >> 0x30);
        uStack_4d0._7_1_ = (char)((ulong)p_Stack_440 >> 0x38);
        auVar29[0] = -((char)((unixFileId *)&psVar14->iVersion)->dev == (char)local_4d8);
        auVar29[1] = -(*(char *)((long)&((unixFileId *)&psVar14->iVersion)->dev + 1) ==
                      local_4d8._1_1_);
        auVar29[2] = -(*(char *)((long)&((unixFileId *)&psVar14->iVersion)->dev + 2) ==
                      local_4d8._2_1_);
        auVar29[3] = -(*(char *)((long)&((unixFileId *)&psVar14->iVersion)->dev + 3) ==
                      local_4d8._3_1_);
        auVar29[4] = -(psVar14->field_0x4 == local_4d8._4_1_);
        auVar29[5] = -(psVar14->field_0x5 == local_4d8._5_1_);
        auVar29[6] = -(psVar14->field_0x6 == local_4d8._6_1_);
        auVar29[7] = -(psVar14->field_0x7 == local_4d8._7_1_);
        auVar29[8] = -(*(char *)&psVar14->xClose == (char)uStack_4d0);
        auVar29[9] = -(*(char *)((long)&psVar14->xClose + 1) == uStack_4d0._1_1_);
        auVar29[10] = -(*(char *)((long)&psVar14->xClose + 2) == uStack_4d0._2_1_);
        auVar29[0xb] = -(*(char *)((long)&psVar14->xClose + 3) == uStack_4d0._3_1_);
        auVar29[0xc] = -(*(char *)((long)&psVar14->xClose + 4) == uStack_4d0._4_1_);
        auVar29[0xd] = -(*(char *)((long)&psVar14->xClose + 5) == uStack_4d0._5_1_);
        auVar29[0xe] = -(*(char *)((long)&psVar14->xClose + 6) == uStack_4d0._6_1_);
        auVar29[0xf] = -(*(char *)((long)&psVar14->xClose + 7) == uStack_4d0._7_1_);
        if ((ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar29[0xf] >> 7) << 0xf) == 0xffff) {
          *(int *)&psVar14->xFileSize = *(int *)&psVar14->xFileSize + 1;
          psVar7 = (sqlite3_io_methods *)inodeList;
          goto LAB_0013461f;
        }
      }
      iVar9 = sqlite3_initialize();
      if (iVar9 == 0) {
        psVar14 = (sqlite3_io_methods *)sqlite3Malloc(0x50);
      }
      else {
        psVar14 = (sqlite3_io_methods *)0x0;
      }
      iVar9 = 7;
      if (psVar14 == (sqlite3_io_methods *)0x0) goto LAB_0013419f;
      *(undefined1 (*) [16])&psVar14->xUnlock = (undefined1  [16])0x0;
      psVar14->xFileSize = (_func_int_sqlite3_file_ptr_sqlite3_int64_ptr *)0x0;
      psVar14->xLock = (_func_int_sqlite3_file_ptr_int *)0x0;
      psVar14->xTruncate = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0;
      psVar14->xSync = (_func_int_sqlite3_file_ptr_int *)0x0;
      *(undefined1 (*) [16])&psVar14->xRead = (undefined1  [16])0x0;
      *(undefined8 *)psVar14 = local_4d8;
      psVar14->xClose = uStack_4d0;
      if (sqlite3Config.bCoreMutex != 0) {
        iVar22 = sqlite3_initialize();
        if (iVar22 == 0) {
          psVar18 = (*sqlite3Config.mutex.xMutexAlloc)(0);
        }
        else {
          psVar18 = (sqlite3_mutex *)0x0;
        }
        psVar14->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)psVar18;
        if (psVar18 == (sqlite3_mutex *)0x0) {
          sqlite3_free(psVar14);
          goto LAB_0013419f;
        }
      }
      *(int *)&psVar14->xFileSize = 1;
      psVar14->xUnlock = (_func_int_sqlite3_file_ptr_int *)inodeList;
      psVar14->xCheckReservedLock = (_func_int_sqlite3_file_ptr_int_ptr *)0x0;
      psVar7 = psVar14;
      if (inodeList != (unixInodeInfo *)0x0) {
        inodeList->pPrev = (unixInodeInfo *)psVar14;
      }
LAB_0013461f:
      inodeList = (unixInodeInfo *)psVar7;
      pFile[2].pMethods = psVar14;
      iVar9 = 0;
      bVar3 = true;
    }
    else {
      piVar13 = __errno_location();
      *(int *)&pFile[4].pMethods = *piVar13;
      iVar9 = 10;
LAB_0013419f:
      bVar3 = false;
    }
    if (!bVar3) {
      robust_close((unixFile *)pFile,local_520,0x94b3);
      local_520 = 0xffffffff;
    }
    if (unixBigLock != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(unixBigLock);
    }
  }
  else {
    iVar9 = 0;
    if (psVar11 == &dotlockIoMethods) {
      sVar12 = strlen(zPath);
      iVar22 = (int)sVar12 + 6;
      iVar9 = sqlite3_initialize();
      if (iVar9 == 0) {
        psVar14 = (sqlite3_io_methods *)sqlite3Malloc((long)iVar22);
      }
      else {
        psVar14 = (sqlite3_io_methods *)0x0;
      }
      if (psVar14 == (sqlite3_io_methods *)0x0) {
        iVar9 = 7;
      }
      else {
        iVar9 = 0;
        sqlite3_snprintf(iVar22,(char *)psVar14,"%s.lock",zPath);
      }
      pFile[5].pMethods = psVar14;
    }
  }
  *(undefined4 *)&pFile[4].pMethods = 0;
  if (iVar9 == 0) {
    pFile->pMethods = psVar11;
    verifyDbFile((unixFile *)pFile);
  }
  else if (-1 < (int)local_520) {
    robust_close((unixFile *)pFile,local_520,0x9508);
  }
LAB_00134685:
  if (iVar9 != 0) {
    sqlite3_free(pFile[6].pMethods);
  }
  return iVar9;
}

Assistant:

static int unixOpen(
  sqlite3_vfs *pVfs,           /* The VFS for which this is the xOpen method */
  const char *zPath,           /* Pathname of file to be opened */
  sqlite3_file *pFile,         /* The file descriptor to be filled in */
  int flags,                   /* Input flags to control the opening */
  int *pOutFlags               /* Output flags returned to SQLite core */
){
  unixFile *p = (unixFile *)pFile;
  int fd = -1;                   /* File descriptor returned by open() */
  int openFlags = 0;             /* Flags to pass to open() */
  int eType = flags&0xFFFFFF00;  /* Type of file to open */
  int noLock;                    /* True to omit locking primitives */
  int rc = SQLITE_OK;            /* Function Return Code */
  int ctrlFlags = 0;             /* UNIXFILE_* flags */

  int isExclusive  = (flags & SQLITE_OPEN_EXCLUSIVE);
  int isDelete     = (flags & SQLITE_OPEN_DELETEONCLOSE);
  int isCreate     = (flags & SQLITE_OPEN_CREATE);
  int isReadonly   = (flags & SQLITE_OPEN_READONLY);
  int isReadWrite  = (flags & SQLITE_OPEN_READWRITE);
#if SQLITE_ENABLE_LOCKING_STYLE
  int isAutoProxy  = (flags & SQLITE_OPEN_AUTOPROXY);
#endif
#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  struct statfs fsInfo;
#endif

  /* If creating a master or main-file journal, this function will open
  ** a file-descriptor on the directory too. The first time unixSync()
  ** is called the directory file descriptor will be fsync()ed and close()d.
  */
  int isNewJrnl = (isCreate && (
        eType==SQLITE_OPEN_MASTER_JOURNAL 
     || eType==SQLITE_OPEN_MAIN_JOURNAL 
     || eType==SQLITE_OPEN_WAL
  ));

  /* If argument zPath is a NULL pointer, this function is required to open
  ** a temporary file. Use this buffer to store the file name in.
  */
  char zTmpname[MAX_PATHNAME+2];
  const char *zName = zPath;

  /* Check the following statements are true: 
  **
  **   (a) Exactly one of the READWRITE and READONLY flags must be set, and 
  **   (b) if CREATE is set, then READWRITE must also be set, and
  **   (c) if EXCLUSIVE is set, then CREATE must also be set.
  **   (d) if DELETEONCLOSE is set, then CREATE must also be set.
  */
  assert((isReadonly==0 || isReadWrite==0) && (isReadWrite || isReadonly));
  assert(isCreate==0 || isReadWrite);
  assert(isExclusive==0 || isCreate);
  assert(isDelete==0 || isCreate);

  /* The main DB, main journal, WAL file and master journal are never 
  ** automatically deleted. Nor are they ever temporary files.  */
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_DB );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MASTER_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_WAL );

  /* Assert that the upper layer has set one of the "file-type" flags. */
  assert( eType==SQLITE_OPEN_MAIN_DB      || eType==SQLITE_OPEN_TEMP_DB 
       || eType==SQLITE_OPEN_MAIN_JOURNAL || eType==SQLITE_OPEN_TEMP_JOURNAL 
       || eType==SQLITE_OPEN_SUBJOURNAL   || eType==SQLITE_OPEN_MASTER_JOURNAL 
       || eType==SQLITE_OPEN_TRANSIENT_DB || eType==SQLITE_OPEN_WAL
  );

  /* Detect a pid change and reset the PRNG.  There is a race condition
  ** here such that two or more threads all trying to open databases at
  ** the same instant might all reset the PRNG.  But multiple resets
  ** are harmless.
  */
  if( randomnessPid!=osGetpid(0) ){
    randomnessPid = osGetpid(0);
    sqlite3_randomness(0,0);
  }
  memset(p, 0, sizeof(unixFile));

  if( eType==SQLITE_OPEN_MAIN_DB ){
    UnixUnusedFd *pUnused;
    pUnused = findReusableFd(zName, flags);
    if( pUnused ){
      fd = pUnused->fd;
    }else{
      pUnused = sqlite3_malloc64(sizeof(*pUnused));
      if( !pUnused ){
        return SQLITE_NOMEM_BKPT;
      }
    }
    p->pPreallocatedUnused = pUnused;

    /* Database filenames are double-zero terminated if they are not
    ** URIs with parameters.  Hence, they can always be passed into
    ** sqlite3_uri_parameter(). */
    assert( (flags & SQLITE_OPEN_URI) || zName[strlen(zName)+1]==0 );

  }else if( !zName ){
    /* If zName is NULL, the upper layer is requesting a temp file. */
    assert(isDelete && !isNewJrnl);
    rc = unixGetTempname(pVfs->mxPathname, zTmpname);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    zName = zTmpname;

    /* Generated temporary filenames are always double-zero terminated
    ** for use by sqlite3_uri_parameter(). */
    assert( zName[strlen(zName)+1]==0 );
  }

  /* Determine the value of the flags parameter passed to POSIX function
  ** open(). These must be calculated even if open() is not called, as
  ** they may be stored as part of the file handle and used by the 
  ** 'conch file' locking functions later on.  */
  if( isReadonly )  openFlags |= O_RDONLY;
  if( isReadWrite ) openFlags |= O_RDWR;
  if( isCreate )    openFlags |= O_CREAT;
  if( isExclusive ) openFlags |= (O_EXCL|O_NOFOLLOW);
  openFlags |= (O_LARGEFILE|O_BINARY);

  if( fd<0 ){
    mode_t openMode;              /* Permissions to create file with */
    uid_t uid;                    /* Userid for the file */
    gid_t gid;                    /* Groupid for the file */
    rc = findCreateFileMode(zName, flags, &openMode, &uid, &gid);
    if( rc!=SQLITE_OK ){
      assert( !p->pPreallocatedUnused );
      assert( eType==SQLITE_OPEN_WAL || eType==SQLITE_OPEN_MAIN_JOURNAL );
      return rc;
    }
    fd = robust_open(zName, openFlags, openMode);
    OSTRACE(("OPENX   %-3d %s 0%o\n", fd, zName, openFlags));
    assert( !isExclusive || (openFlags & O_CREAT)!=0 );
    if( fd<0 ){
      if( isNewJrnl && errno==EACCES && osAccess(zName, F_OK) ){
        /* If unable to create a journal because the directory is not
        ** writable, change the error code to indicate that. */
        rc = SQLITE_READONLY_DIRECTORY;
      }else if( errno!=EISDIR && isReadWrite ){
        /* Failed to open the file for read/write access. Try read-only. */
        flags &= ~(SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE);
        openFlags &= ~(O_RDWR|O_CREAT);
        flags |= SQLITE_OPEN_READONLY;
        openFlags |= O_RDONLY;
        isReadonly = 1;
        fd = robust_open(zName, openFlags, openMode);
      }
    }
    if( fd<0 ){
      int rc2 = unixLogError(SQLITE_CANTOPEN_BKPT, "open", zName);
      if( rc==SQLITE_OK ) rc = rc2;
      goto open_finished;
    }

    /* If this process is running as root and if creating a new rollback
    ** journal or WAL file, set the ownership of the journal or WAL to be
    ** the same as the original database.
    */
    if( flags & (SQLITE_OPEN_WAL|SQLITE_OPEN_MAIN_JOURNAL) ){
      robustFchown(fd, uid, gid);
    }
  }
  assert( fd>=0 );
  if( pOutFlags ){
    *pOutFlags = flags;
  }

  if( p->pPreallocatedUnused ){
    p->pPreallocatedUnused->fd = fd;
    p->pPreallocatedUnused->flags = flags;
  }

  if( isDelete ){
#if OS_VXWORKS
    zPath = zName;
#elif defined(SQLITE_UNLINK_AFTER_CLOSE)
    zPath = sqlite3_mprintf("%s", zName);
    if( zPath==0 ){
      robust_close(p, fd, __LINE__);
      return SQLITE_NOMEM_BKPT;
    }
#else
    osUnlink(zName);
#endif
  }
#if SQLITE_ENABLE_LOCKING_STYLE
  else{
    p->openFlags = openFlags;
  }
#endif
  
#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  if( fstatfs(fd, &fsInfo) == -1 ){
    storeLastErrno(p, errno);
    robust_close(p, fd, __LINE__);
    return SQLITE_IOERR_ACCESS;
  }
  if (0 == strncmp("msdos", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
  if (0 == strncmp("exfat", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
#endif

  /* Set up appropriate ctrlFlags */
  if( isDelete )                ctrlFlags |= UNIXFILE_DELETE;
  if( isReadonly )              ctrlFlags |= UNIXFILE_RDONLY;
  noLock = eType!=SQLITE_OPEN_MAIN_DB;
  if( noLock )                  ctrlFlags |= UNIXFILE_NOLOCK;
  if( isNewJrnl )               ctrlFlags |= UNIXFILE_DIRSYNC;
  if( flags & SQLITE_OPEN_URI ) ctrlFlags |= UNIXFILE_URI;

#if SQLITE_ENABLE_LOCKING_STYLE
#if SQLITE_PREFER_PROXY_LOCKING
  isAutoProxy = 1;
#endif
  if( isAutoProxy && (zPath!=NULL) && (!noLock) && pVfs->xOpen ){
    char *envforce = getenv("SQLITE_FORCE_PROXY_LOCKING");
    int useProxy = 0;

    /* SQLITE_FORCE_PROXY_LOCKING==1 means force always use proxy, 0 means 
    ** never use proxy, NULL means use proxy for non-local files only.  */
    if( envforce!=NULL ){
      useProxy = atoi(envforce)>0;
    }else{
      useProxy = !(fsInfo.f_flags&MNT_LOCAL);
    }
    if( useProxy ){
      rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);
      if( rc==SQLITE_OK ){
        rc = proxyTransformUnixFile((unixFile*)pFile, ":auto:");
        if( rc!=SQLITE_OK ){
          /* Use unixClose to clean up the resources added in fillInUnixFile 
          ** and clear all the structure's references.  Specifically, 
          ** pFile->pMethods will be NULL so sqlite3OsClose will be a no-op 
          */
          unixClose(pFile);
          return rc;
        }
      }
      goto open_finished;
    }
  }
#endif
  
  assert( zPath==0 || zPath[0]=='/' 
      || eType==SQLITE_OPEN_MASTER_JOURNAL || eType==SQLITE_OPEN_MAIN_JOURNAL 
  );
  rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);

open_finished:
  if( rc!=SQLITE_OK ){
    sqlite3_free(p->pPreallocatedUnused);
  }
  return rc;
}